

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplatedCustomNamer.cpp
# Opt level: O2

DefaultNamerDisposer *
ApprovalTests::TemplatedCustomNamer::useAsDefaultNamer
          (DefaultNamerDisposer *__return_storage_ptr__,string *templateString)

{
  undefined8 uVar1;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  undefined8 uStack_30;
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  ::std::__cxx11::string::string((string *)&local_48,(string *)templateString);
  local_18 = (code *)0x0;
  pcStack_10 = (code *)0x0;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_28._M_unused._M_object = operator_new(0x20);
  uVar1 = local_40;
  *(code **)local_28._M_unused._0_8_ = (code *)((long)local_28._M_unused._0_8_ + 0x10);
  if (local_48 == &local_38) {
    *(ulong *)((long)local_28._M_unused._0_8_ + 0x10) = CONCAT71(uStack_37,local_38);
    *(undefined8 *)((long)local_28._M_unused._0_8_ + 0x18) = uStack_30;
  }
  else {
    *(undefined1 **)local_28._M_unused._0_8_ = local_48;
    *(ulong *)((long)local_28._M_unused._0_8_ + 0x10) = CONCAT71(uStack_37,local_38);
  }
  local_40 = 0;
  *(undefined8 *)((long)local_28._M_unused._0_8_ + 8) = uVar1;
  local_38 = 0;
  pcStack_10 = ::std::
               _Function_handler<std::shared_ptr<ApprovalTests::ApprovalNamer>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:97:45)>
               ::_M_invoke;
  local_18 = ::std::
             _Function_handler<std::shared_ptr<ApprovalTests::ApprovalNamer>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/TemplatedCustomNamer.cpp:97:45)>
             ::_M_manager;
  local_48 = &local_38;
  TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::
  useAsDefaultNamer(__return_storage_ptr__,(NamerCreator *)&local_28);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_28);
  ::std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

DefaultNamerDisposer
    TemplatedCustomNamer::useAsDefaultNamer(std::string templateString)
    {
        return Approvals::useAsDefaultNamer([=]() { return create(templateString); });
    }